

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void ga_acc_twist_log(ga_acc_twist *xdd)

{
  undefined8 in_RAX;
  
  if (xdd == (ga_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x1cd,"void ga_acc_twist_log(const struct ga_acc_twist *)");
  }
  if (xdd->target_body == (body *)0x0) {
    __assert_fail("xdd->target_body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x1ce,"void ga_acc_twist_log(const struct ga_acc_twist *)");
  }
  if (xdd->reference_body == (body *)0x0) {
    __assert_fail("xdd->reference_body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x1cf,"void ga_acc_twist_log(const struct ga_acc_twist *)");
  }
  if (xdd->point != (point *)0x0) {
    if (xdd->frame != (frame *)0x0) {
      printf("AccelerationADT(target=%s|%s, reference=%s, frame={%s})\n",xdd->point->name,
             xdd->target_body->name,xdd->reference_body->name,xdd->frame->name,in_RAX);
      return;
    }
    __assert_fail("xdd->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x1d1,"void ga_acc_twist_log(const struct ga_acc_twist *)");
  }
  __assert_fail("xdd->point",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x1d0,"void ga_acc_twist_log(const struct ga_acc_twist *)");
}

Assistant:

void ga_acc_twist_log(
        const struct ga_acc_twist *xdd)
{
    assert(xdd);
    assert(xdd->target_body);
    assert(xdd->reference_body);
    assert(xdd->point);
    assert(xdd->frame);

    printf("AccelerationADT(target=%s|%s, reference=%s, frame={%s})\n",
            xdd->point->name,
            xdd->target_body->name,
            xdd->reference_body->name,
            xdd->frame->name);
}